

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O0

void point_mul(u8 *d,u8 *a,u8 *b)

{
  byte local_25;
  uint local_24;
  u8 mask;
  u32 i;
  u8 *b_local;
  u8 *a_local;
  u8 *d_local;
  
  elt_zero(d);
  elt_zero(d + 0x1e);
  for (local_24 = 0; local_24 < 0x1e; local_24 = local_24 + 1) {
    for (local_25 = 0x80; local_25 != 0; local_25 = (byte)((int)(uint)local_25 >> 1)) {
      point_double(d,d);
      if ((a[local_24] & local_25) != 0) {
        point_add(d,d,b);
      }
    }
  }
  return;
}

Assistant:

static void point_mul(u8 *d, u8 *a, u8 *b)	// a is bignum
{
	u32 i;
	u8 mask;

	elt_zero(d);
	elt_zero(d + 30);

	for (i = 0; i < 30; i++)
		for (mask = 0x80; mask != 0; mask >>= 1) {
			point_double(d, d);
			if ((a[i] & mask) != 0)
				point_add(d, d, b);
		}
}